

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O0

int testInvalidEmbeddingBias(void)

{
  ModelDescription *pMVar1;
  FeatureDescription *pFVar2;
  FeatureType *pFVar3;
  ArrayFeatureType *this;
  NeuralNetwork *this_00;
  NeuralNetworkLayer *this_01;
  WeightParams *this_02;
  ostream *poVar4;
  undefined1 local_b8 [8];
  Result res;
  EmbeddingLayerParams *params;
  NeuralNetworkLayer *embeddingLayer;
  NeuralNetwork *nn;
  FeatureDescription *out3;
  ArrayFeatureType *shape;
  FeatureDescription *topIn;
  int num_outputs;
  int num_inputs;
  Model m1;
  
  CoreML::Specification::Model::Model((Model *)&num_outputs);
  pMVar1 = CoreML::Specification::Model::mutable_description((Model *)&num_outputs);
  pFVar2 = CoreML::Specification::ModelDescription::add_input(pMVar1);
  CoreML::Specification::FeatureDescription::set_name(pFVar2,"input");
  pFVar3 = CoreML::Specification::FeatureDescription::mutable_type(pFVar2);
  this = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar3);
  CoreML::Specification::ArrayFeatureType::add_shape(this,1);
  pMVar1 = CoreML::Specification::Model::mutable_description((Model *)&num_outputs);
  pFVar2 = CoreML::Specification::ModelDescription::add_output(pMVar1);
  CoreML::Specification::FeatureDescription::set_name(pFVar2,"probs");
  pFVar3 = CoreML::Specification::FeatureDescription::mutable_type(pFVar2);
  CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar3);
  this_00 = CoreML::Specification::Model::mutable_neuralnetwork((Model *)&num_outputs);
  this_01 = CoreML::Specification::NeuralNetwork::add_layers(this_00);
  CoreML::Specification::NeuralNetworkLayer::add_input(this_01,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output(this_01,"probs");
  res.m_message._M_storage._M_storage =
       (uchar  [8])CoreML::Specification::NeuralNetworkLayer::mutable_embedding(this_01);
  CoreML::Specification::EmbeddingLayerParams::set_inputdim
            ((EmbeddingLayerParams *)res.m_message._M_storage._M_storage,5);
  CoreML::Specification::EmbeddingLayerParams::set_outputchannels
            ((EmbeddingLayerParams *)res.m_message._M_storage._M_storage,3);
  CoreML::Specification::EmbeddingLayerParams::set_hasbias
            ((EmbeddingLayerParams *)res.m_message._M_storage._M_storage,true);
  for (res.m_message.super__Rb_tree_node_base._M_right._4_4_ = 0;
      res.m_message.super__Rb_tree_node_base._M_right._4_4_ < 0xf;
      res.m_message.super__Rb_tree_node_base._M_right._4_4_ =
           res.m_message.super__Rb_tree_node_base._M_right._4_4_ + 1) {
    this_02 = CoreML::Specification::EmbeddingLayerParams::mutable_weights
                        ((EmbeddingLayerParams *)res.m_message._M_storage._M_storage);
    CoreML::Specification::WeightParams::add_floatvalue(this_02,1.0);
  }
  CoreML::validate<(MLModelType)500>((Result *)local_b8,(Model *)&num_outputs);
  m1._oneof_case_[0]._0_1_ = CoreML::Result::good((Result *)local_b8);
  if (m1._oneof_case_[0]._0_1_) {
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xade);
    poVar4 = std::operator<<(poVar4,": error: ");
    poVar4 = std::operator<<(poVar4,"!((res).good())");
    poVar4 = std::operator<<(poVar4," was false, expected true.");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  m1._oneof_case_[0]._1_3_ = 0;
  CoreML::Result::~Result((Result *)local_b8);
  CoreML::Specification::Model::~Model((Model *)&num_outputs);
  return m1._oneof_case_[0];
}

Assistant:

int testInvalidEmbeddingBias() {

    Specification::Model m1;

    int num_inputs = 5;
    int num_outputs = 3;

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(1);

    auto *out3 = m1.mutable_description()->add_output();
    out3->set_name("probs");
    out3->mutable_type()->mutable_multiarraytype();

    const auto nn = m1.mutable_neuralnetwork();

    Specification::NeuralNetworkLayer *embeddingLayer = nn->add_layers();
    embeddingLayer->add_input("input");
    embeddingLayer->add_output("probs");
    auto *params = embeddingLayer->mutable_embedding();
    params->set_inputdim(num_inputs);
    params->set_outputchannels(num_outputs);

    params->set_hasbias(true);

    for (int i = 0; i < num_inputs * num_outputs; i++) {
        params->mutable_weights()->add_floatvalue(1.0);
    }

    // Not specifying the right number of bias weights should be invalid

    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_BAD(res);
    return 0;
}